

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O3

int __thiscall NodeBTree::lessThanKeyCompareOp(NodeBTree *this,KeyType *key,uint8_t *data)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  byte *pbVar5;
  ulong uVar6;
  
  uVar6 = (ulong)*data;
  if ((char)*data < '\0') {
    pbVar5 = data + 1;
    uVar4 = 0x80;
    do {
      bVar1 = *pbVar5;
      lVar2 = uVar6 - uVar4;
      uVar4 = uVar4 << 7;
      pbVar5 = pbVar5 + 1;
      uVar3 = lVar2 * 0x100;
      uVar6 = bVar1 | uVar3;
    } while ((uVar3 & uVar4) != 0);
  }
  return -(uint)(key->m_nodeIndex < (uint)uVar6) | 1;
}

Assistant:

static inline uint64_t decodeBitsAndAdvance(const uint8_t*& data)
{
	uint64_t value = *data++;
	uint64_t mask = 0x80;
	while (value & mask) {
		value = ((value - mask) << 8) | (*data++);
		mask <<= 7;
	}
	return value;
}